

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relivedb.cpp
# Opt level: O1

void __thiscall relive::ReLiveDB::deepFetch(ReLiveDB *this,Station *station,bool withoutStreams)

{
  pointer pSVar1;
  int iVar2;
  Url *api;
  pointer pSVar3;
  vector<relive::Url,_std::allocator<relive::Url>_> apis;
  vector<relive::Url,_std::allocator<relive::Url>_> webSites;
  order_by_t<long_relive::Stream::*> res;
  vector<relive::Stream,_std::allocator<relive::Stream>_> local_e0;
  vector<relive::Stream,_std::allocator<relive::Stream>_> local_c8;
  vector<relive::Url,_std::allocator<relive::Url>_> local_b0;
  undefined1 local_98 [8];
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  offset_in_Stream_to_long local_70;
  vector<relive::Url,_std::allocator<relive::Url>_> local_68;
  undefined1 local_50;
  undefined7 uStack_4f;
  offset_in_Stream_to_long local_40;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->_mutex);
  if (iVar2 == 0) {
    if (!withoutStreams) {
      storage_abi_cxx11_();
      local_b0.super__Vector_base<relive::Url,_std::allocator<relive::Url>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)station->_id;
      local_b0.super__Vector_base<relive::Url,_std::allocator<relive::Url>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x10;
      local_68.super__Vector_base<relive::Url,_std::allocator<relive::Url>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((ulong)local_68.super__Vector_base<relive::Url,_std::allocator<relive::Url>_>.
                            _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
      local_68.super__Vector_base<relive::Url,_std::allocator<relive::Url>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_50 = 0;
      local_40 = 0x78;
      local_98._0_4_ = 0;
      local_90._M_p = (pointer)&local_80;
      local_68.super__Vector_base<relive::Url,_std::allocator<relive::Url>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&stack0xffffffffffffffb0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,(pointer)&stack0xffffffffffffffb0,
                 (pointer)&stack0xffffffffffffffb0);
      local_70 = local_40;
      local_98._0_4_ = -1;
      sqlite_orm::internal::storage_t<$86c824a$>::
      get_all<relive::Stream,_sqlite_orm::internal::where_t<sqlite_orm::internal::is_equal_t<long_relive::Stream::*,_long>_>,_sqlite_orm::internal::order_by_t<long_relive::Stream::*>_>
                (&local_e0,&storage[abi:cxx11]()::_storage_abi_cxx11_,
                 (where_t<sqlite_orm::internal::is_equal_t<long_relive::Stream::*,_long>_> *)
                 &local_b0,(order_by_t<long_relive::Stream::*> *)local_98);
      local_c8.super__Vector_base<relive::Stream,_std::allocator<relive::Stream>_>._M_impl.
      super__Vector_impl_data._M_start =
           (station->_streams).super__Vector_base<relive::Stream,_std::allocator<relive::Stream>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_c8.super__Vector_base<relive::Stream,_std::allocator<relive::Stream>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (station->_streams).super__Vector_base<relive::Stream,_std::allocator<relive::Stream>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_c8.super__Vector_base<relive::Stream,_std::allocator<relive::Stream>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (station->_streams).super__Vector_base<relive::Stream,_std::allocator<relive::Stream>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      (station->_streams).super__Vector_base<relive::Stream,_std::allocator<relive::Stream>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_e0.super__Vector_base<relive::Stream,_std::allocator<relive::Stream>_>._M_impl.
           super__Vector_impl_data._M_start;
      (station->_streams).super__Vector_base<relive::Stream,_std::allocator<relive::Stream>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_e0.super__Vector_base<relive::Stream,_std::allocator<relive::Stream>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (station->_streams).super__Vector_base<relive::Stream,_std::allocator<relive::Stream>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_e0.super__Vector_base<relive::Stream,_std::allocator<relive::Stream>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_e0.super__Vector_base<relive::Stream,_std::allocator<relive::Stream>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_e0.super__Vector_base<relive::Stream,_std::allocator<relive::Stream>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e0.super__Vector_base<relive::Stream,_std::allocator<relive::Stream>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<relive::Stream,_std::allocator<relive::Stream>_>::~vector(&local_c8);
      std::vector<relive::Stream,_std::allocator<relive::Stream>_>::~vector(&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_p != &local_80) {
        operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
      }
      if (local_68.super__Vector_base<relive::Url,_std::allocator<relive::Url>_>._M_impl.
          super__Vector_impl_data._M_finish != (pointer)&stack0xffffffffffffffb0) {
        operator_delete(local_68.super__Vector_base<relive::Url,_std::allocator<relive::Url>_>.
                        _M_impl.super__Vector_impl_data._M_finish,CONCAT71(uStack_4f,local_50) + 1);
      }
    }
    storage_abi_cxx11_();
    local_88 = station->_id;
    local_90._M_p = (pointer)0x8;
    local_80._M_allocated_capacity = 0x38;
    local_80._8_4_ = 1;
    sqlite_orm::internal::storage_t<$86c824a$>::
    get_all<relive::Url,_sqlite_orm::internal::where_t<sqlite_orm::internal::and_condition_t<sqlite_orm::internal::is_equal_t<long_relive::Url::*,_long>,_sqlite_orm::internal::is_equal_t<int_relive::Url::*,_int>_>_>_>
              ((vector<relive::Url,_std::allocator<relive::Url>_> *)&local_c8,
               &storage[abi:cxx11]()::_storage_abi_cxx11_,
               (where_t<sqlite_orm::internal::and_condition_t<sqlite_orm::internal::is_equal_t<long_relive::Url::*,_long>,_sqlite_orm::internal::is_equal_t<int_relive::Url::*,_int>_>_>
                *)local_98);
    if (local_c8.super__Vector_base<relive::Stream,_std::allocator<relive::Stream>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_c8.super__Vector_base<relive::Stream,_std::allocator<relive::Stream>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__cxx11::string::_M_assign((string *)&station->_webSiteUrl);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(&station->_api,
                      (station->_api).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    storage_abi_cxx11_();
    local_88 = station->_id;
    local_90._M_p = (pointer)0x8;
    local_80._M_allocated_capacity = 0x38;
    local_80._8_4_ = 0;
    sqlite_orm::internal::storage_t<$86c824a$>::
    get_all<relive::Url,_sqlite_orm::internal::where_t<sqlite_orm::internal::and_condition_t<sqlite_orm::internal::is_equal_t<long_relive::Url::*,_long>,_sqlite_orm::internal::is_equal_t<int_relive::Url::*,_int>_>_>_>
              ((vector<relive::Url,_std::allocator<relive::Url>_> *)&local_e0,
               &storage[abi:cxx11]()::_storage_abi_cxx11_,
               (where_t<sqlite_orm::internal::and_condition_t<sqlite_orm::internal::is_equal_t<long_relive::Url::*,_long>,_sqlite_orm::internal::is_equal_t<int_relive::Url::*,_int>_>_>
                *)local_98);
    pSVar1 = local_e0.super__Vector_base<relive::Stream,_std::allocator<relive::Stream>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pSVar3 = local_e0.super__Vector_base<relive::Stream,_std::allocator<relive::Stream>_>.
                  _M_impl.super__Vector_impl_data._M_start; pSVar3 != pSVar1;
        pSVar3 = (pointer)&(pSVar3->_description)._M_string_length) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&station->_api,(value_type *)&pSVar3->_stationId);
    }
    storage_abi_cxx11_();
    local_88 = station->_id;
    local_90._M_p = (pointer)0x8;
    local_80._M_allocated_capacity = 0x38;
    local_80._8_4_ = 3;
    sqlite_orm::internal::storage_t<$86c824a$>::
    get_all<relive::Url,_sqlite_orm::internal::where_t<sqlite_orm::internal::and_condition_t<sqlite_orm::internal::is_equal_t<long_relive::Url::*,_long>,_sqlite_orm::internal::is_equal_t<int_relive::Url::*,_int>_>_>_>
              (&local_b0,&storage[abi:cxx11]()::_storage_abi_cxx11_,
               (where_t<sqlite_orm::internal::and_condition_t<sqlite_orm::internal::is_equal_t<long_relive::Url::*,_long>,_sqlite_orm::internal::is_equal_t<int_relive::Url::*,_int>_>_>
                *)local_98);
    local_68.super__Vector_base<relive::Url,_std::allocator<relive::Url>_>._M_impl.
    super__Vector_impl_data._M_start =
         (station->_liveStream).super__Vector_base<relive::Url,_std::allocator<relive::Url>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_68.super__Vector_base<relive::Url,_std::allocator<relive::Url>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (station->_liveStream).super__Vector_base<relive::Url,_std::allocator<relive::Url>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_68.super__Vector_base<relive::Url,_std::allocator<relive::Url>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (station->_liveStream).super__Vector_base<relive::Url,_std::allocator<relive::Url>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    (station->_liveStream).super__Vector_base<relive::Url,_std::allocator<relive::Url>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_b0.super__Vector_base<relive::Url,_std::allocator<relive::Url>_>._M_impl.
         super__Vector_impl_data._M_start;
    (station->_liveStream).super__Vector_base<relive::Url,_std::allocator<relive::Url>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_b0.super__Vector_base<relive::Url,_std::allocator<relive::Url>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (station->_liveStream).super__Vector_base<relive::Url,_std::allocator<relive::Url>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_b0.super__Vector_base<relive::Url,_std::allocator<relive::Url>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_b0.super__Vector_base<relive::Url,_std::allocator<relive::Url>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b0.super__Vector_base<relive::Url,_std::allocator<relive::Url>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b0.super__Vector_base<relive::Url,_std::allocator<relive::Url>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<relive::Url,_std::allocator<relive::Url>_>::~vector(&local_68);
    std::vector<relive::Url,_std::allocator<relive::Url>_>::~vector(&local_b0);
    std::vector<relive::Url,_std::allocator<relive::Url>_>::~vector
              ((vector<relive::Url,_std::allocator<relive::Url>_> *)&local_e0);
    std::vector<relive::Url,_std::allocator<relive::Url>_>::~vector
              ((vector<relive::Url,_std::allocator<relive::Url>_> *)&local_c8);
    pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void ReLiveDB::deepFetch(Station& station, bool withoutStreams)
{
    std::lock_guard<Mutex> lock{_mutex};
    if (!withoutStreams) {
        station._streams = storage().get_all<Stream>(where(c(&Stream::_stationId) == station._id), order_by(&Stream::_timestamp).desc());
    }
    auto webSites = storage().get_all<Url>(where(c(&Url::_ownerId) == station._id and c(&Url::_type) == int(Url::eWeb)));
    if (!webSites.empty()) {
        station._webSiteUrl = webSites.front()._url;
    }
    station._api.clear();
    auto apis = storage().get_all<Url>(where(c(&Url::_ownerId) == station._id and c(&Url::_type) == int(Url::eStationAPI)));
    for (const auto& api : apis) {
        station._api.push_back(api._url);
    }
    station._liveStream = storage().get_all<Url>(where(c(&Url::_ownerId) == station._id and c(&Url::_type) == int(Url::eLiveStream)));
}